

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckArray2DCloseDoesNotHaveSideEffectsWhenFailing::
~TestCheckArray2DCloseDoesNotHaveSideEffectsWhenFailing
          (TestCheckArray2DCloseDoesNotHaveSideEffectsWhenFailing *this)

{
  TestCheckArray2DCloseDoesNotHaveSideEffectsWhenFailing *this_local;
  
  ~TestCheckArray2DCloseDoesNotHaveSideEffectsWhenFailing(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckArray2DCloseDoesNotHaveSideEffectsWhenFailing)
{
    g_sideEffect = 0;
    {
        UnitTest::TestResults testResults;
		ScopedCurrentTest scopedResults(testResults);

		const float data[2][2] = { {0, 1}, {3, 3} };
        CHECK_ARRAY2D_CLOSE (data, FunctionWithSideEffects3(), 2, 2, 0.01f);
    }
    CHECK_EQUAL(1, g_sideEffect);
}